

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::debug_logger<true>::log<int,int,double,double>
          (debug_logger<true> *this,string_view fmt,int *args,int *args_1,double *args_2,
          double *args_3)

{
  double *args_local_2;
  int *args_local_1;
  int *args_local;
  debug_logger<true> *this_local;
  string_view fmt_local;
  
  fmt_local._M_len = (size_t)fmt._M_str;
  this_local = (debug_logger<true> *)fmt._M_len;
  ::fmt::v7::
  print<std::basic_string_view<char,std::char_traits<char>>,int_const&,int_const&,double_const&,double_const&,char>
            (this->ofs,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,args,args_1,
             args_2,args_3);
  return;
}

Assistant:

void log([[maybe_unused]] const std::string_view fmt,
             [[maybe_unused]] const Args&... args) const noexcept
    {
        if constexpr (debug) {
            fmt::print(ofs, fmt, args...);
        }
    }